

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_impl_avx2.c
# Opt level: O1

uint aom_sad_skip_128x128_avx2(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = sad64x64(src_ptr,src_stride * 2,ref_ptr,ref_stride * 2);
  uVar2 = sad64x64(src_ptr + 0x40,src_stride * 2,ref_ptr + 0x40,ref_stride * 2);
  return (uVar2 + uVar1) * 2;
}

Assistant:

unsigned int aom_sad_skip_128x128_avx2(const uint8_t *src_ptr, int src_stride,
                                       const uint8_t *ref_ptr, int ref_stride) {
  const uint32_t sum =
      aom_sad128x64_avx2(src_ptr, 2 * src_stride, ref_ptr, 2 * ref_stride);
  return 2 * sum;
}